

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O1

int __thiscall ncnn::Reshape::forward(Reshape *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  undefined4 *puVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 *puVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  undefined4 *puVar14;
  Mat local_58;
  
  iVar11 = bottom_blob->w;
  iVar8 = bottom_blob->h;
  iVar7 = iVar8 * iVar11 * bottom_blob->c;
  iVar9 = this->ndim;
  if (iVar9 == 3) {
    if (this->w != 0) {
      iVar11 = this->w;
    }
    if (this->h != 0) {
      iVar8 = this->h;
    }
    iVar9 = bottom_blob->c;
    if (this->c != 0) {
      iVar9 = this->c;
    }
    if (iVar11 == -1) {
      iVar11 = (int)((long)((ulong)(uint)((int)((long)iVar7 / (long)iVar9) >> 0x1f) << 0x20 |
                           (long)iVar7 / (long)iVar9 & 0xffffffffU) / (long)iVar8);
    }
    if (iVar8 == -1) {
      iVar8 = (int)((long)((ulong)(uint)((int)((long)iVar7 / (long)iVar9) >> 0x1f) << 0x20 |
                          (long)iVar7 / (long)iVar9 & 0xffffffffU) / (long)iVar11);
    }
    if (iVar9 == -1) {
      iVar9 = (int)((long)((ulong)(uint)((int)((long)iVar7 / (long)iVar8) >> 0x1f) << 0x20 |
                          (long)iVar7 / (long)iVar8 & 0xffffffffU) / (long)iVar11);
    }
    Mat::reshape(&local_58,bottom_blob,iVar11,iVar8,iVar9,opt->blob_allocator);
    if (&local_58 != top_blob) {
      if (local_58.refcount != (int *)0x0) {
        LOCK();
        *local_58.refcount = *local_58.refcount + 1;
        UNLOCK();
      }
      piVar5 = top_blob->refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->cstep = 0;
      top_blob->data = local_58.data;
      top_blob->refcount = local_58.refcount;
      top_blob->elemsize = local_58.elemsize;
      top_blob->elempack = local_58.elempack;
      top_blob->allocator = local_58.allocator;
      top_blob->dims = local_58.dims;
      top_blob->w = local_58.w;
      top_blob->h = local_58.h;
      top_blob->c = local_58.c;
      top_blob->cstep = local_58.cstep;
    }
    if (local_58.refcount == (int *)0x0) goto LAB_0014ed12;
    LOCK();
    *local_58.refcount = *local_58.refcount + -1;
    UNLOCK();
    if (*local_58.refcount != 0) goto LAB_0014ed12;
    if (local_58.allocator != (Allocator *)0x0) {
      (**(code **)(*(long *)local_58.allocator + 0x18))();
      goto LAB_0014ed12;
    }
  }
  else if (iVar9 == 2) {
    if (this->w != 0) {
      iVar11 = this->w;
    }
    if (this->h != 0) {
      iVar8 = this->h;
    }
    if (iVar11 == -1) {
      iVar11 = iVar7 / iVar8;
    }
    if (iVar8 == -1) {
      iVar8 = iVar7 / iVar11;
    }
    Mat::reshape(&local_58,bottom_blob,iVar11,iVar8,opt->blob_allocator);
    if (&local_58 != top_blob) {
      if (local_58.refcount != (int *)0x0) {
        LOCK();
        *local_58.refcount = *local_58.refcount + 1;
        UNLOCK();
      }
      piVar5 = top_blob->refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->cstep = 0;
      top_blob->data = local_58.data;
      top_blob->refcount = local_58.refcount;
      top_blob->elemsize = local_58.elemsize;
      top_blob->elempack = local_58.elempack;
      top_blob->allocator = local_58.allocator;
      top_blob->dims = local_58.dims;
      top_blob->w = local_58.w;
      top_blob->h = local_58.h;
      top_blob->c = local_58.c;
      top_blob->cstep = local_58.cstep;
    }
    if (local_58.refcount == (int *)0x0) goto LAB_0014ed12;
    LOCK();
    *local_58.refcount = *local_58.refcount + -1;
    UNLOCK();
    if (*local_58.refcount != 0) goto LAB_0014ed12;
    if (local_58.allocator != (Allocator *)0x0) {
      (**(code **)(*(long *)local_58.allocator + 0x18))();
      goto LAB_0014ed12;
    }
  }
  else {
    if (iVar9 != 1) goto LAB_0014ed12;
    if (this->w != 0) {
      iVar11 = this->w;
    }
    if (iVar11 == -1) {
      iVar11 = iVar7;
    }
    if (this->permute == 1) {
      Mat::create(top_blob,iVar11,bottom_blob->elemsize,opt->blob_allocator);
      puVar6 = (undefined4 *)top_blob->data;
      if (puVar6 == (undefined4 *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      iVar11 = bottom_blob->h;
      if (0 < iVar11) {
        uVar1 = bottom_blob->w;
        uVar2 = bottom_blob->c;
        iVar8 = 0;
        do {
          if (0 < (int)uVar1) {
            puVar10 = (undefined4 *)((long)(bottom_blob->w * iVar8) * 4 + (long)bottom_blob->data);
            sVar3 = bottom_blob->cstep;
            sVar4 = bottom_blob->elemsize;
            uVar12 = 0;
            do {
              uVar13 = (ulong)uVar2;
              puVar14 = puVar10;
              if (0 < (int)uVar2) {
                do {
                  *puVar6 = *puVar14;
                  puVar6 = puVar6 + 1;
                  puVar14 = (undefined4 *)((long)puVar14 + sVar3 * sVar4);
                  uVar13 = uVar13 - 1;
                } while (uVar13 != 0);
              }
              uVar12 = uVar12 + 1;
              puVar10 = puVar10 + 1;
            } while (uVar12 != uVar1);
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 != iVar11);
      }
      goto LAB_0014ed12;
    }
    Mat::reshape(&local_58,bottom_blob,iVar11,opt->blob_allocator);
    if (&local_58 != top_blob) {
      if (local_58.refcount != (int *)0x0) {
        LOCK();
        *local_58.refcount = *local_58.refcount + 1;
        UNLOCK();
      }
      piVar5 = top_blob->refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->cstep = 0;
      top_blob->data = local_58.data;
      top_blob->refcount = local_58.refcount;
      top_blob->elemsize = local_58.elemsize;
      top_blob->elempack = local_58.elempack;
      top_blob->allocator = local_58.allocator;
      top_blob->dims = local_58.dims;
      top_blob->w = local_58.w;
      top_blob->h = local_58.h;
      top_blob->c = local_58.c;
      top_blob->cstep = local_58.cstep;
    }
    if (local_58.refcount == (int *)0x0) goto LAB_0014ed12;
    LOCK();
    *local_58.refcount = *local_58.refcount + -1;
    UNLOCK();
    if (*local_58.refcount != 0) goto LAB_0014ed12;
    if (local_58.allocator != (Allocator *)0x0) {
      (**(code **)(*(long *)local_58.allocator + 0x18))();
      goto LAB_0014ed12;
    }
  }
  if (local_58.data != (void *)0x0) {
    free(local_58.data);
  }
LAB_0014ed12:
  if (top_blob->data == (void *)0x0) {
    iVar11 = -100;
  }
  else {
    iVar11 = -100;
    if ((long)top_blob->c * top_blob->cstep != 0) {
      iVar11 = 0;
    }
  }
  return iVar11;
}

Assistant:

int Reshape::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    size_t elemsize = bottom_blob.elemsize;
    int total = bottom_blob.w * bottom_blob.h * bottom_blob.c;

    if (ndim == 1)
    {
        int _w = w;

        if (_w == 0)
            _w = bottom_blob.w;

        if (_w == -1)
            _w = total;

        if (permute == 1)
        {
            top_blob.create(_w, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            // c-h-w to h-w-c
            float* ptr = top_blob;
            for (int i=0; i<bottom_blob.h; i++)
            {
                for (int j=0; j<bottom_blob.w; j++)
                {
                    for (int p=0; p<bottom_blob.c; p++)
                    {
                        const float* bptr = bottom_blob.channel(p);
                        *ptr++ = bptr[i*bottom_blob.w + j];
                    }
                }
            }
        }
        else
        {
            top_blob = bottom_blob.reshape(_w, opt.blob_allocator);
        }
    }
    else if (ndim == 2)
    {
        int _w = w;
        int _h = h;

        if (_w == 0)
            _w = bottom_blob.w;
        if (_h == 0)
            _h = bottom_blob.h;

        if (_w == -1)
            _w = total / _h;
        if (_h == -1)
            _h = total / _w;

        top_blob = bottom_blob.reshape(_w, _h, opt.blob_allocator);
    }
    else if (ndim == 3)
    {
        int _w = w;
        int _h = h;
        int _c = c;

        if (_w == 0)
            _w = bottom_blob.w;
        if (_h == 0)
            _h = bottom_blob.h;
        if (_c == 0)
            _c = bottom_blob.c;

        if (_w == -1)
            _w = total / _c / _h;
        if (_h == -1)
            _h = total / _c / _w;
        if (_c == -1)
            _c = total / _h / _w;

        top_blob = bottom_blob.reshape(_w, _h, _c, opt.blob_allocator);
    }

    if (top_blob.empty())
        return -100;

    return 0;
}